

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

void __thiscall
mocker::anon_unknown_5::FindPureFunctions::operator()(FindPureFunctions *this,IfStmt *node)

{
  long *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<mocker::ast::Expression,void>
            ((__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2> *)&local_28,
             &(node->condition).
              super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*local_28 + 0x18))(local_28,this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  std::__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<mocker::ast::Statement,void>
            ((__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2> *)&local_28,
             &(node->then).super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*local_28 + 0x18))(local_28,this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  if ((node->else_).super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mocker::ast::Statement,void>
              ((__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2> *)&local_28,
               &(node->else_).super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>
              );
    (**(code **)(*local_28 + 0x18))(local_28,this);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  }
  return;
}

Assistant:

void operator()(const ast::IfStmt &node) const override {
    visit(node.condition);
    visit(node.then);
    if (node.else_)
      visit(node.else_);
  }